

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

void CEditor::CallbackAppendMap(char *pFileName,int StorageType,void *pUser)

{
  int iVar1;
  
  iVar1 = Append((CEditor *)pUser,pFileName,StorageType);
  if (iVar1 == 0) {
    SortImages((CEditor *)pUser);
  }
  else {
    *(undefined1 *)((long)pUser + 0x49c) = 0;
  }
  *(undefined4 *)((long)pUser + 0x47c) = 0;
  return;
}

Assistant:

void CEditor::CallbackAppendMap(const char *pFileName, int StorageType, void *pUser)
{
	CEditor *pEditor = (CEditor*)pUser;
	if(pEditor->Append(pFileName, StorageType))
		pEditor->m_aFileName[0] = 0;
	else
		pEditor->SortImages();

	pEditor->m_Dialog = DIALOG_NONE;
}